

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleSerialAnalyzer.cpp
# Opt level: O2

void __thiscall SimpleSerialAnalyzer::WorkerThread(SimpleSerialAnalyzer *this)

{
  SimpleSerialAnalyzerResults *pSVar1;
  U32 UVar2;
  int iVar3;
  MarkerType MVar4;
  AnalyzerChannelData *pAVar5;
  undefined8 uVar6;
  bool bVar7;
  Frame frame;
  
  UVar2 = Analyzer::GetSampleRate();
  this->mSampleRateHz = UVar2;
  pAVar5 = (AnalyzerChannelData *)Analyzer::GetAnalyzerChannelData((Channel *)this);
  this->mSerial = pAVar5;
  iVar3 = AnalyzerChannelData::GetBitState();
  if (iVar3 == 0) {
    AnalyzerChannelData::AdvanceToNextEdge();
  }
  do {
    AnalyzerChannelData::AdvanceToNextEdge();
    uVar6 = AnalyzerChannelData::GetSampleNumber();
    AnalyzerChannelData::Advance((uint)this->mSerial);
    iVar3 = 8;
    while (bVar7 = iVar3 != 0, iVar3 = iVar3 + -1, bVar7) {
      pSVar1 = (this->mResults)._M_t.
               super___uniq_ptr_impl<SimpleSerialAnalyzerResults,_std::default_delete<SimpleSerialAnalyzerResults>_>
               ._M_t.
               super__Tuple_impl<0UL,_SimpleSerialAnalyzerResults_*,_std::default_delete<SimpleSerialAnalyzerResults>_>
               .super__Head_base<0UL,_SimpleSerialAnalyzerResults_*,_false>._M_head_impl;
      MVar4 = AnalyzerChannelData::GetSampleNumber();
      AnalyzerResults::AddMarker((ulonglong)pSVar1,MVar4,(Channel *)0x0);
      AnalyzerChannelData::GetBitState();
      AnalyzerChannelData::Advance((uint)this->mSerial);
    }
    Frame::Frame(&frame);
    _frame = uVar6;
    AnalyzerChannelData::GetSampleNumber();
    AnalyzerResults::AddFrame
              ((Frame *)(this->mResults)._M_t.
                        super___uniq_ptr_impl<SimpleSerialAnalyzerResults,_std::default_delete<SimpleSerialAnalyzerResults>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_SimpleSerialAnalyzerResults_*,_std::default_delete<SimpleSerialAnalyzerResults>_>
                        .super__Head_base<0UL,_SimpleSerialAnalyzerResults_*,_false>._M_head_impl);
    AnalyzerResults::CommitResults();
    Analyzer::ReportProgress((ulonglong)this);
    Frame::~Frame(&frame);
  } while( true );
}

Assistant:

void SimpleSerialAnalyzer::WorkerThread()
{
	mSampleRateHz = GetSampleRate();

	mSerial = GetAnalyzerChannelData( mSettings.mInputChannel );

	if( mSerial->GetBitState() == BIT_LOW )
		mSerial->AdvanceToNextEdge();

	U32 samples_per_bit = mSampleRateHz / mSettings.mBitRate;
	U32 samples_to_first_center_of_first_data_bit = U32( 1.5 * double( mSampleRateHz ) / double( mSettings.mBitRate ) );

	for( ; ; )
	{
		U8 data = 0;
		U8 mask = 1 << 7;
		
		mSerial->AdvanceToNextEdge(); //falling edge -- beginning of the start bit

		U64 starting_sample = mSerial->GetSampleNumber();

		mSerial->Advance( samples_to_first_center_of_first_data_bit );

		for( U32 i=0; i<8; i++ )
		{
			//let's put a dot exactly where we sample this bit:
			mResults->AddMarker( mSerial->GetSampleNumber(), AnalyzerResults::Dot, mSettings.mInputChannel );

			if( mSerial->GetBitState() == BIT_HIGH )
				data |= mask;

			mSerial->Advance( samples_per_bit );

			mask = mask >> 1;
		}


		//we have a byte to save. 
		Frame frame;
		frame.mData1 = data;
		frame.mFlags = 0;
		frame.mStartingSampleInclusive = starting_sample;
		frame.mEndingSampleInclusive = mSerial->GetSampleNumber();

		mResults->AddFrame( frame );
		mResults->CommitResults();
		ReportProgress( frame.mEndingSampleInclusive );
	}
}